

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O3

void Js::JavascriptBigInt::SubAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  ulong uVar5;
  code *pcVar6;
  bool bVar7;
  int iVar8;
  undefined4 *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  iVar8 = CompareAbsolute(pbi1,pbi2);
  if (iVar8 != 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x1e6,"(pbi1->CompareAbsolute(pbi2) == 1)",
                                "pbi1->CompareAbsolute(pbi2) == 1");
    if (!bVar7) goto LAB_00d22169;
    *puVar9 = 0;
  }
  puVar2 = (pbi1->m_digits).ptr;
  if (pbi2->m_length == 0) {
    uVar12 = pbi1->m_length;
  }
  else {
    puVar3 = (pbi2->m_digits).ptr;
    uVar10 = 0;
    uVar14 = 0;
    do {
      uVar13 = uVar14;
      uVar11 = uVar10;
      uVar4 = puVar2[uVar11];
      uVar5 = puVar3[uVar11];
      uVar15 = uVar4 - uVar5;
      uVar14 = (ulong)(uVar4 < uVar5) + 1;
      if (uVar13 <= uVar15) {
        uVar14 = (ulong)(uVar4 < uVar5);
      }
      puVar2[uVar11] = uVar15 - uVar13;
      uVar10 = uVar11 + 1;
    } while (uVar10 < pbi2->m_length);
    uVar12 = pbi1->m_length;
    if ((uVar10 < uVar12) && (uVar15 < uVar13 || uVar4 < uVar5)) {
      uVar11 = uVar11 + 2;
      do {
        puVar1 = puVar2 + (uVar11 - 1);
        bVar7 = *puVar1 < uVar14;
        *puVar1 = *puVar1 - uVar14;
        uVar12 = pbi1->m_length;
        if (uVar12 <= uVar11) break;
        uVar14 = (ulong)bVar7;
        uVar11 = uVar11 + 1;
      } while (bVar7);
    }
  }
  while (uVar12 != 0) {
    uVar12 = uVar12 - 1;
    if (puVar2[uVar12] != 0) {
      return;
    }
    pbi1->m_length = uVar12;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar9 = 1;
  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                              ,0x1ff,"(pbi1->m_length > 0)","pbi1->m_length > 0");
  if (bVar7) {
    *puVar9 = 0;
    return;
  }
LAB_00d22169:
  pcVar6 = (code *)invalidInstructionException();
  (*pcVar6)();
}

Assistant:

void JavascriptBigInt::SubAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        Assert(pbi1->CompareAbsolute(pbi2) == 1);
        digit_t carryDigit = 0;
        digit_t *pDigit1 = pbi1->m_digits;
        digit_t *pDigit2 = pbi2->m_digits;
        digit_t i = 0;

        for (; i < pbi2->m_length; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], pDigit2[i], &tempCarryDigit);
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }

        for (; i < pbi1->m_length && carryDigit > 0; i++)
        {
            digit_t tempCarryDigit = 0;
            pDigit1[i] = JavascriptBigInt::SubDigit(pDigit1[i], carryDigit, &tempCarryDigit);
            carryDigit = tempCarryDigit;
        }
        // adjust length
        while ((pbi1->m_length>0) && (pbi1->m_digits[pbi1->m_length-1] == 0))
        {
            pbi1->m_length--;
        }
        Assert(pbi1->m_length > 0);
    }